

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

int Lodtalk::ScriptContext::stExecuteFileNamed(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar4;
  undefined4 extraout_var_02;
  anon_union_8_4_0eb573b0_for_Oop_0 aStack_108;
  int res;
  undefined1 local_100 [8];
  string fullFileName;
  undefined1 local_d8 [8];
  string fileNameString;
  string local_b0;
  undefined1 local_90 [8];
  string basePathString;
  allocator local_59;
  string local_58;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  Oop fileNameOop;
  ScriptContext *self;
  VMContext *context;
  InterpreterProxy *interpreter_local;
  undefined4 extraout_var_01;
  
  iVar2 = (**interpreter->_vptr_InterpreterProxy)();
  iVar3 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var_00,iVar3) == 1) {
    aVar4._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])();
    aVar4.uintValue._4_4_ = extraout_var_01;
    fileNameOop.field_0 = aVar4;
    local_38._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    local_38.uintValue._4_4_ = extraout_var_02;
    bVar1 = Oop::isNil((Oop *)&local_38);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,"expected a file name.",&local_59);
      nativeError(&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    std::__cxx11::string::string((string *)local_90);
    bVar1 = Oop::isNil((Oop *)(aVar4.uintValue + 0x20));
    if (!bVar1) {
      fileNameString.field_2._8_8_ = *(anon_union_8_4_0eb573b0_for_Oop_0 *)(aVar4.uintValue + 0x20);
      VMContext::getByteStringData_abi_cxx11_
                (&local_b0,(VMContext *)CONCAT44(extraout_var,iVar2),
                 (Oop)fileNameString.field_2._8_8_);
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    fullFileName.field_2._8_8_ = local_38;
    VMContext::getByteStringData_abi_cxx11_
              ((string *)local_d8,(VMContext *)CONCAT44(extraout_var,iVar2),(Oop)local_38);
    joinPath((string *)local_100,(string *)local_90,(string *)local_d8);
    Oop::Oop((Oop *)&stack0xfffffffffffffef8);
    (*interpreter->_vptr_InterpreterProxy[1])(interpreter,aStack_108.pointer);
    interpreter_local._4_4_ = executeScriptFromFileNamed(interpreter,(string *)local_100);
    if (interpreter_local._4_4_ == 0) {
      interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x11])();
    }
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)local_90);
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int ScriptContext::stExecuteFileNamed(InterpreterProxy *interpreter)
{
    auto context = interpreter->getContext();
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();
    auto self = reinterpret_cast<ScriptContext*> (interpreter->getReceiver().pointer);

    auto fileNameOop = interpreter->getTemporary(0);
	if(fileNameOop.isNil())
		nativeError("expected a file name.");

    std::string basePathString;
	if(!self->basePath.isNil())
		basePathString = context->getByteStringData(self->basePath);
	std::string fileNameString = context->getByteStringData(fileNameOop);
	std::string fullFileName = joinPath(basePathString, fileNameString);

    interpreter->pushOop(Oop());
	auto res = executeScriptFromFileNamed(interpreter, fullFileName);
    if(res != 0)
        return res;
    return interpreter->returnTop();
}